

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O2

void __thiscall fat::print_file_clusters(fat *this,string *file_path)

{
  int iVar1;
  ostream *poVar2;
  int32_t *piVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  char local_59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_59 = '/';
  explode(&local_40,(fat *)file_path,file_path,&local_59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,&local_40);
  iVar1 = get_file_start(this,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)file_path);
    poVar2 = std::operator<<(poVar2,": ");
    std::ostream::operator<<(poVar2,iVar1);
    piVar3 = this->fat_table;
    for (; piVar3[iVar1] != this->FAT_FILE_END; iVar1 = piVar3[iVar1]) {
      poVar2 = std::operator<<((ostream *)&std::cout,", ");
      std::ostream::operator<<(poVar2,this->fat_table[iVar1]);
      piVar3 = this->fat_table;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

void fat::print_file_clusters(std::string file_path) {
    std::vector<std::string> result = explode(file_path, '/');
    int32_t found_file = get_file_start(result);
    if (found_file != 0) {
        std::cout << file_path << ": " << found_file;
        int32_t curr_cluster = found_file;
        while (fat_table[curr_cluster] != FAT_FILE_END) {
            std::cout << ", " << fat_table[curr_cluster];
            curr_cluster = fat_table[curr_cluster];
        }
        std::cout << std::endl;
    } else {
        std::cout << "PATH NOT FOUND" << std::endl;
    }
}